

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_generalized_cepstral_analysis.cc
# Opt level: O0

void __thiscall
sptk::AdaptiveGeneralizedCepstralAnalysis::AdaptiveGeneralizedCepstralAnalysis
          (AdaptiveGeneralizedCepstralAnalysis *this,int num_order,int num_stage,double min_epsilon,
          double momentum,double forgetting_factor,double step_size_factor,bool gain_flag)

{
  bool bVar1;
  byte in_CL;
  int in_EDX;
  GeneralizedCepstrumInverseGainNormalization *in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  _func_int **in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  in_RDI->_vptr_GeneralizedCepstrumInverseGainNormalization =
       (_func_int **)&PTR__AdaptiveGeneralizedCepstralAnalysis_0012bcc8;
  in_RDI->num_order_ = in_EDX;
  in_RDI->gamma_ = in_XMM0_Qa;
  *(undefined8 *)&in_RDI->is_valid_ = in_XMM1_Qa;
  in_RDI[1]._vptr_GeneralizedCepstrumInverseGainNormalization = in_XMM2_Qa;
  *(undefined8 *)&in_RDI[1].num_order_ = in_XMM3_Qa;
  *(byte *)&in_RDI[1].gamma_ = in_CL & 1;
  GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            (in_RDI,(int)((ulong)&in_RDI[1].is_valid_ >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  in_RDI[2].is_valid_ = true;
  if ((((((in_RDI->num_order_ < 1) || (in_RDI->gamma_ <= 0.0)) ||
        (*(double *)&in_RDI->is_valid_ <= 0.0 && *(double *)&in_RDI->is_valid_ != 0.0)) ||
       ((1.0 <= *(double *)&in_RDI->is_valid_ ||
        ((double)in_RDI[1]._vptr_GeneralizedCepstrumInverseGainNormalization <= 0.0 &&
         (double)in_RDI[1]._vptr_GeneralizedCepstrumInverseGainNormalization != 0.0)))) ||
      ((1.0 <= (double)in_RDI[1]._vptr_GeneralizedCepstrumInverseGainNormalization ||
       ((*(double *)&in_RDI[1].num_order_ <= 0.0 || (1.0 <= *(double *)&in_RDI[1].num_order_))))))
     || (bVar1 = GeneralizedCepstrumInverseGainNormalization::IsValid
                           ((GeneralizedCepstrumInverseGainNormalization *)&in_RDI[1].is_valid_),
        !bVar1)) {
    in_RDI[2].is_valid_ = false;
  }
  return;
}

Assistant:

AdaptiveGeneralizedCepstralAnalysis::AdaptiveGeneralizedCepstralAnalysis(
    int num_order, int num_stage, double min_epsilon, double momentum,
    double forgetting_factor, double step_size_factor, bool gain_flag)
    : num_stage_(num_stage),
      min_epsilon_(min_epsilon),
      momentum_(momentum),
      forgetting_factor_(forgetting_factor),
      step_size_factor_(step_size_factor),
      gain_flag_(gain_flag),
      generalized_cepstrum_inverse_gain_normalization_(num_order,
                                                       -1.0 / num_stage_),
      is_valid_(true) {
  if (num_stage_ <= 0 || min_epsilon_ <= 0.0 || momentum_ < 0.0 ||
      1.0 <= momentum_ || forgetting_factor_ < 0.0 ||
      1.0 <= forgetting_factor_ || step_size_factor_ <= 0.0 ||
      1.0 <= step_size_factor_ ||
      !generalized_cepstrum_inverse_gain_normalization_.IsValid()) {
    is_valid_ = false;
    return;
  }
}